

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_1::ImageView::Resources::Resources
          (Resources *this,Environment *env,Parameters *params)

{
  Handle<(vk::HandleType)9> HVar1;
  DeviceInterface *pDVar2;
  VkDevice pVVar3;
  VkAllocationCallbacks *pVVar4;
  VkResult result;
  int iVar5;
  Parameters *in_RCX;
  undefined1 local_68 [24];
  VkAllocationCallbacks *pVStack_50;
  RefBase<vk::Handle<(vk::HandleType)9>_> local_48;
  
  Image::create((Move<vk::Handle<(vk::HandleType)9>_> *)&local_48,env,(Resources *)params,in_RCX);
  pVVar4 = local_48.m_data.deleter.m_allocator;
  pVVar3 = local_48.m_data.deleter.m_device;
  pDVar2 = local_48.m_data.deleter.m_deviceIface;
  HVar1.m_internal = local_48.m_data.object.m_internal;
  local_68._16_8_ = local_48.m_data.deleter.m_device;
  pVStack_50 = local_48.m_data.deleter.m_allocator;
  local_68._0_8_ = local_48.m_data.object.m_internal;
  local_68._8_8_ = local_48.m_data.deleter.m_deviceIface;
  local_48.m_data.object.m_internal = 0;
  local_48.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_48.m_data.deleter.m_device = (VkDevice)0x0;
  local_48.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_device =
       pVVar3;
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_allocator =
       pVVar4;
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.object.m_internal =
       HVar1.m_internal;
  (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.deleter.m_deviceIface =
       pDVar2;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)9>_>::~RefBase(&local_48);
  ::vk::getImageMemoryRequirements
            ((VkMemoryRequirements *)local_68,env->vkd,env->device,
             (VkImage)(this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal);
  if (local_68._16_4_ == 0) {
    iVar5 = 0x20;
  }
  else {
    iVar5 = 0;
    if (local_68._16_4_ != 0) {
      for (; ((uint)local_68._16_4_ >> iVar5 & 1) == 0; iVar5 = iVar5 + 1) {
      }
    }
  }
  local_48.m_data.object.m_internal = local_68._0_8_;
  local_48.m_data.deleter.m_deviceIface =
       (DeviceInterface *)CONCAT44(local_48.m_data.deleter.m_deviceIface._4_4_,iVar5);
  Dependency<vkt::api::(anonymous_namespace)::DeviceMemory>::Dependency
            (&this->memory,env,(Parameters *)&local_48);
  result = (*env->vkd->_vptr_DeviceInterface[0xd])
                     (env->vkd,env->device,
                      (this->image).object.super_RefBase<vk::Handle<(vk::HandleType)9>_>.m_data.
                      object.m_internal,
                      (this->memory).object.super_RefBase<vk::Handle<(vk::HandleType)7>_>.m_data.
                      object.m_internal,0);
  ::vk::checkResult(result,"env.vkd.bindImageMemory(env.device, *image.object, *memory.object, 0)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiObjectManagementTests.cpp"
                    ,0x356);
  return;
}

Assistant:

Resources (const Environment& env, const Parameters& params)
			: image	(env, params.image)
			, memory(env, getDeviceMemoryParameters(env, *image.object))
		{
			VK_CHECK(env.vkd.bindImageMemory(env.device, *image.object, *memory.object, 0));
		}